

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cc
# Opt level: O3

void __thiscall re2c::BitMap::BitMap(BitMap *this,Go *g,State *x)

{
  this->go = g;
  this->on = x;
  this->next = first;
  this->i = 0;
  this->m = 0;
  first = this;
  return;
}

Assistant:

BitMap::BitMap(const Go *g, const State *x)
	: go(g)
	, on(x)
	, next(first)
	, i(0)
	, m(0)
{
	first = this;
}